

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::insert
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  int *piVar1;
  UnresolvedSplitRecord *pUVar2;
  UnresolvedSplitRecord *pUVar3;
  long lVar4;
  undefined4 uVar5;
  anon_union_4_2_6ecd024b_for_Entry_0 aVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  TermList TVar10;
  BindingMap *pBVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Node *pNVar16;
  undefined4 extraout_var;
  Node *pNVar17;
  undefined4 extraout_var_00;
  Entry *pEVar18;
  Node **leaf;
  Term *t;
  ulong uVar19;
  ItemIteratorCore *this_00;
  anon_union_4_2_6ecd024b_for_Entry_0 *paVar20;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  Entry *pEVar21;
  TermList *term_2;
  TermList *this_01;
  uint64_t *puVar22;
  Node **ppNVar23;
  int iVar24;
  TermList *pTVar25;
  uint *var;
  TermList *pTVar26;
  bool bVar27;
  Top TVar28;
  Stack<Kernel::TermList_*> subterms;
  TermList term;
  uint boundVar;
  uint boundVar_1;
  Stack<Kernel::TermList_*> local_208;
  TermList local_1e8;
  BindingMap *local_1e0;
  Node **local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  uint64_t uStack_1c0;
  LeafData *local_1b0;
  FixedSizeAllocator<32UL> *local_1a8;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_1a0;
  SelectedSummand local_198;
  SelectedSummand local_168;
  SelectedSummand local_138;
  undefined1 local_108 [72];
  Rhs local_c0;
  Rhs local_90;
  Rhs local_60;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  ppNVar23 = &this->_root;
  local_1a0 = this;
  if (this->_root == (Node *)0x0) {
    if (svBindings->_size == 0) {
      pNVar16 = (Node *)::Lib::FixedSizeAllocator<32UL>::alloc
                                  ((FixedSizeAllocator<32UL> *)
                                   (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      (pNVar16->_term)._content = 2;
      pNVar16->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b57e30;
      pNVar16[1]._vptr_Node = (_func_int **)0x0;
      *(undefined4 *)&pNVar16[1]._term._content = 0;
      Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs(&local_60,ld);
      (*pNVar16->_vptr_Node[9])(pNVar16,&local_60);
      *ppNVar23 = pNVar16;
      return;
    }
    local_208._capacity = (size_t)svBindings->_entries;
    local_208._stack = (TermList **)svBindings->_afterLast;
    local_208._cursor = (TermList **)CONCAT44(local_208._cursor._4_4_,svBindings->_timestamp);
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::Iterator::
    hasNext((Iterator *)&local_208);
    uVar15 = *(uint *)(local_208._capacity + 4);
    local_208._capacity = (size_t)(local_208._capacity + 0x10);
    pNVar16 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)
                                 (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    (pNVar16->_term)._content = 2;
    *(uint *)&pNVar16[1]._vptr_Node = uVar15;
    pNVar16->_vptr_Node = (_func_int **)&PTR__UArrIntermediateNode_00b57fd0;
    *(undefined4 *)((long)&pNVar16[1]._vptr_Node + 4) = 0;
    pNVar16[1]._term._content = 0;
    *ppNVar23 = pNVar16;
  }
  if (svBindings->_size == 0) {
    ensureLeafEfficiency((Leaf **)ppNVar23);
    pNVar16 = *ppNVar23;
    local_138.super_SelectedLiteral.litIdx =
         (ld->super_SelectedSummand).super_SelectedLiteral.litIdx;
    local_138.super_SelectedLiteral.cl = (ld->super_SelectedSummand).super_SelectedLiteral.cl;
    local_138.super_SelectedLiteral.interpreted.
    super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
    ._isSome = (ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
               super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
               ._isSome;
    if (local_138.super_SelectedLiteral.interpreted.
        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
        ._isSome == true) {
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._21_7_ = 0;
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._0_5_ =
           *(uint5 *)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem & 0xffffffff03;
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._5_3_ = 0;
      uVar8 = *(undefined8 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 9);
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._9_3_ = (undefined3)uVar8;
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._8_4_ =
           (uint)(uint3)local_138.super_SelectedLiteral.interpreted.
                        super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                        ._elem._elem._9_3_ << 8;
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0xf] = (char)((ulong)uVar8 >> 0x38);
      uVar5 = *(undefined4 *)
               ((long)&(ld->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._elem._elem + 0x11);
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem._17_3_ = (undefined3)uVar5;
      local_138.super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem.init._inner.
      super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      .
      super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
      ._content[0x13] = (char)((uint)uVar5 >> 0x18);
    }
    local_138.super_SelectedLiteral._44_4_ =
         *(undefined4 *)&(ld->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
    Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs(&local_90,&local_138);
    (*pNVar16->_vptr_Node[9])(pNVar16,&local_90);
  }
  else {
    local_1b0 = ld;
    if (insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Rhs)
        ::unresolvedSplits == '\0') {
      insert();
    }
    insert::unresolvedSplits._size = 0;
    local_1a8 = (FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48);
    local_1e0 = svBindings;
    do {
      iVar13 = (*((Node *)&(*ppNVar23)->_vptr_Node)->_vptr_Node[2])();
      if ((char)iVar13 == '\0') {
        iVar13 = (*((Node *)&(*ppNVar23)->_vptr_Node)->_vptr_Node[5])();
        iVar24 = 0;
        bVar12 = false;
        if (iVar13 != 1) goto LAB_003336b6;
        pNVar16 = *ppNVar23;
        iVar13 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[4])(pNVar16);
        pBVar11 = local_1e0;
        bVar12 = iVar13 == 1;
        if (bVar12) {
          local_1c8 = CONCAT44(local_1c8._4_4_,
                               *(undefined4 *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node);
          pNVar17 = (Node *)pNVar16[1]._term._content;
          pEVar18 = ::Lib::
                    DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                    findEntry(local_1e0,(uint *)&local_1c8);
          if (pEVar18 == (Entry *)0x0) {
            uVar19 = (pNVar17->_term)._content;
            bVar27 = true;
            if ((uVar19 & 3) == 0) {
              bVar27 = (bool)((*(byte *)(uVar19 + 0x28) & 8) >> 3);
              bVar12 = bVar27 != false && bVar12;
            }
          }
          else {
            local_208._capacity = CONCAT44(local_208._capacity._4_4_,(uint)local_1c8);
            pEVar18 = ::Lib::
                      DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
                      findEntry(pBVar11,(uint *)&local_208);
            local_208._capacity = (pEVar18->_val)._content;
            TVar28 = Kernel::TermList::top((TermList *)&local_208);
            iVar13 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[10])
                               (pNVar16,TVar28._inner._inner._0_8_,
                                (ulong)(TVar28._inner._inner._8_4_ & 0xff),0);
            bVar27 = CONCAT44(extraout_var,iVar13) == 0;
          }
          iVar24 = 0;
          if (bVar27 != false) {
            uVar15 = *(uint *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node;
            uVar7 = (pNVar17->_term)._content;
            if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
              ::expand(&insert::unresolvedSplits);
            }
            pUVar3 = insert::unresolvedSplits._data1;
            uVar14 = insert::unresolvedSplits._size + 1;
            insert::unresolvedSplits._size = uVar14;
            insert::unresolvedSplits._data1[uVar14].var = uVar15;
            pUVar3[uVar14].original._content = uVar7;
            ::Lib::
            BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
            ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
            (pNVar17->_term)._content = (pNVar16->_term)._content;
            *ppNVar23 = pNVar17;
            (pNVar16->_term)._content = 2;
            (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[0xc])(pNVar16);
            (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[1])(pNVar16);
            iVar24 = 2;
          }
        }
        leaf = ppNVar23;
        if (iVar24 == 0) goto LAB_003336b6;
      }
      else {
        bVar12 = false;
LAB_003336b6:
        if (insert::unresolvedSplits._size != 0 && !bVar12) {
          do {
            pUVar3 = insert::unresolvedSplits._data;
            uVar15 = (insert::unresolvedSplits._data)->var;
            local_1d8 = (Node **)((insert::unresolvedSplits._data)->original)._content;
            uVar14 = insert::unresolvedSplits._size - 1;
            insert::unresolvedSplits._size = uVar14;
            if (uVar14 != 0) {
              local_208._capacity = *(size_t *)insert::unresolvedSplits._data;
              local_208._stack = (TermList **)((insert::unresolvedSplits._data)->original)._content;
              pUVar2 = insert::unresolvedSplits._data + uVar14;
              uVar5 = *(undefined4 *)&pUVar2->field_0x4;
              uVar7 = (pUVar2->original)._content;
              pUVar3->var = pUVar2->var;
              *(undefined4 *)&pUVar3->field_0x4 = uVar5;
              (pUVar3->original)._content = uVar7;
              pUVar3 = pUVar3 + uVar14;
              *(size_t *)pUVar3 = local_208._capacity;
              (pUVar3->original)._content = (uint64_t)local_208._stack;
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
              ::bubbleDown(&insert::unresolvedSplits,1);
            }
            pNVar16 = *ppNVar23;
            uVar7 = (pNVar16->_term)._content;
            pNVar17 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                        ((FixedSizeAllocator<64UL> *)
                                         (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
            (pNVar17->_term)._content = uVar7;
            *(uint *)&((Node *)&pNVar17[1]._vptr_Node)->_vptr_Node = uVar15;
            ((Node *)&pNVar17->_vptr_Node)->_vptr_Node =
                 (_func_int **)&PTR__UArrIntermediateNode_00b57fd0;
            *(undefined4 *)((long)&((Node *)&pNVar17[1]._vptr_Node)->_vptr_Node + 4) = 0;
            pNVar17[1]._term._content = 0;
            (pNVar16->_term)._content = (uint64_t)local_1d8;
            *ppNVar23 = pNVar17;
            TVar28 = Kernel::TermList::top(&pNVar16->_term);
            iVar13 = (*((Node *)&pNVar17->_vptr_Node)->_vptr_Node[10])
                               (pNVar17,TVar28._inner._inner._0_8_,
                                (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
            *(Node **)CONCAT44(extraout_var_00,iVar13) = pNVar16;
          } while (insert::unresolvedSplits._size != 0);
        }
        pBVar11 = local_1e0;
        pNVar16 = *ppNVar23;
        local_1cc = *(undefined4 *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node;
        local_208._capacity = CONCAT44(local_208._capacity._4_4_,local_1cc);
        pEVar18 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                  ::findEntry(local_1e0,(uint *)&local_208);
        local_1e8._content = (pEVar18->_val)._content;
        ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   local_108,(char *)pBVar11);
        this_01 = &local_1e8;
        TVar28 = Kernel::TermList::top(this_01);
        iVar13 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[10])
                           (pNVar16,TVar28._inner._inner._0_8_,
                            (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
        leaf = (Node **)CONCAT44(extraout_var_01,iVar13);
        if (*leaf == (Node *)0x0) {
          local_208._capacity = 0;
          local_208._stack = (TermList **)0x0;
          local_208._cursor = (TermList **)0x0;
          local_1d8 = ppNVar23;
          this_00 = (ItemIteratorCore *)::operator_new(0x28);
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _refCnt = 0;
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b542a0;
          pEVar18 = local_1e0->_afterLast;
          (this_00->_base)._next = local_1e0->_entries;
          (this_00->_base)._last = pEVar18;
          (this_00->_base)._timestamp = local_1e0->_timestamp;
          (this_00->super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
          _refCnt = 1;
          bVar12 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                   ::ItemIteratorCore::hasNext(this_00);
          uVar15 = (uint)bVar12;
          if (bVar12) {
            iVar13 = (*(this_00->
                       super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                       )._vptr_IteratorCore[3])(this_00);
            paVar20 = (anon_union_4_2_6ecd024b_for_Entry_0 *)CONCAT44(extraout_var_02,iVar13);
            puVar22 = extraout_RDX;
          }
          else {
            puVar22 = (uint64_t *)0x0;
            paVar20 = (anon_union_4_2_6ecd024b_for_Entry_0 *)0x0;
          }
          while ((char)uVar15 != '\0') {
            aVar6 = *paVar20;
            uVar7 = *puVar22;
            if (local_208._capacity._4_4_ == (int)local_208._capacity) {
              ::Lib::
              BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
              ::expand((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                        *)&local_208);
            }
            uVar15 = (int)local_208._capacity + 1;
            local_208._capacity = CONCAT44(local_208._capacity._4_4_,uVar15);
            ((Entry *)((long)local_208._cursor + (ulong)uVar15 * 0x10))->field_0 = aVar6;
            (((Entry *)((long)local_208._cursor + (ulong)uVar15 * 0x10))->_val)._content = uVar7;
            if (1 < uVar15) {
              uVar19 = (ulong)uVar15;
              do {
                uVar19 = uVar19 >> 1;
                if ((uint)((Entry *)((long)local_208._cursor + (ulong)uVar15 * 0x10))->field_0 <=
                    (uint)((Entry *)((long)local_208._cursor + uVar19 * 0x10))->field_0) break;
                pEVar18 = (Entry *)((long)local_208._cursor + (ulong)uVar15 * 0x10);
                pEVar21 = (Entry *)((long)local_208._cursor + uVar19 * 0x10);
                local_1c8._0_4_ = *(uint *)&pEVar18->field_0;
                local_1c8._4_4_ = pEVar18->_key;
                uStack_1c0 = (pEVar18->_val)._content;
                uVar14 = pEVar21->_key;
                uVar7 = (pEVar21->_val)._content;
                pEVar18->field_0 = pEVar21->field_0;
                pEVar18->_key = uVar14;
                (pEVar18->_val)._content = uVar7;
                pEVar21->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)(uint)local_1c8;
                pEVar21->_key = local_1c8._4_4_;
                (pEVar21->_val)._content = uStack_1c0;
                bVar12 = 3 < uVar15;
                uVar15 = (uint)uVar19;
              } while (bVar12);
            }
            uVar15 = (*(this_00->
                       super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                       )._vptr_IteratorCore[2])(this_00);
            if ((char)uVar15 != '\0') {
              iVar13 = (*(this_00->
                         super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                         )._vptr_IteratorCore[3])(this_00);
              paVar20 = (anon_union_4_2_6ecd024b_for_Entry_0 *)CONCAT44(extraout_var_03,iVar13);
              puVar22 = extraout_RDX_00;
            }
          }
          piVar1 = &(this_00->
                    super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
                    _refCnt;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            (*(this_00->
              super_IteratorCore<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>).
              _vptr_IteratorCore[1])(this_00);
          }
          while (TVar10._content = local_1e8._content, (int)local_208._capacity != 0) {
            aVar6 = *(anon_union_4_2_6ecd024b_for_Entry_0 *)local_208._stack;
            uVar7 = ((TermList *)((long)local_208._stack + 8))->_content;
            uVar15 = (int)local_208._capacity - 1;
            local_208._capacity = CONCAT44(local_208._capacity._4_4_,uVar15);
            if (uVar15 != 0) {
              local_1c8 = (long)*local_208._stack;
              uStack_1c0 = ((TermList *)((long)local_208._stack + 8))->_content;
              uVar9 = (((Entry *)((long)local_208._stack + (ulong)uVar15 * 0x10))->_val)._content;
              *local_208._stack =
                   (TermList *)*(long *)((long)local_208._stack + (ulong)uVar15 * 0x10);
              ((TermList *)((long)local_208._stack + 8))->_content = uVar9;
              pEVar18 = (Entry *)((long)local_208._stack + (ulong)uVar15 * 0x10);
              pEVar18->field_0 = (anon_union_4_2_6ecd024b_for_Entry_0)(int)local_1c8;
              pEVar18->_key = (int)((ulong)local_1c8 >> 0x20);
              (pEVar18->_val)._content = uStack_1c0;
              ::Lib::
              BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
              ::bubbleDown((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                            *)&local_208,1);
            }
            TVar10._content = local_1e8._content;
            pNVar16 = (Node *)::Lib::FixedSizeAllocator<64UL>::alloc
                                        ((FixedSizeAllocator<64UL> *)
                                         (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
            (pNVar16->_term)._content = TVar10._content;
            *(anon_union_4_2_6ecd024b_for_Entry_0 *)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node =
                 aVar6;
            ((Node *)&pNVar16->_vptr_Node)->_vptr_Node =
                 (_func_int **)&PTR__UArrIntermediateNode_00b57fd0;
            *(undefined4 *)((long)&((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node + 4) = 0;
            pNVar16[1]._term._content = 0;
            *leaf = pNVar16;
            local_1e8._content = uVar7;
            TVar28 = Kernel::TermList::top(&local_1e8);
            iVar13 = (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[10])
                               (pNVar16,TVar28._inner._inner._0_8_,
                                (ulong)(TVar28._inner._inner._8_4_ & 0xff),1);
            leaf = (Node **)CONCAT44(extraout_var_04,iVar13);
          }
          pNVar16 = (Node *)::Lib::FixedSizeAllocator<32UL>::alloc(local_1a8);
          ppNVar23 = local_1d8;
          (pNVar16->_term)._content = TVar10._content;
          ((Node *)&pNVar16->_vptr_Node)->_vptr_Node = (_func_int **)&PTR__UListLeaf_00b57e30;
          ((Node *)&pNVar16[1]._vptr_Node)->_vptr_Node = (_func_int **)0x0;
          *(undefined4 *)&pNVar16[1]._term._content = 0;
          *leaf = pNVar16;
          local_168.super_SelectedLiteral.litIdx =
               (local_1b0->super_SelectedSummand).super_SelectedLiteral.litIdx;
          local_168.super_SelectedLiteral.cl =
               (local_1b0->super_SelectedSummand).super_SelectedLiteral.cl;
          local_168.super_SelectedLiteral.interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome = (local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._isSome;
          if (local_168.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._isSome == true) {
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._21_7_ = 0;
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._0_5_ =
                 CONCAT41(*(undefined4 *)
                           ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.
                                   interpreted.
                                   super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                   ._elem._elem + 1),
                          *(undefined1 *)
                           &(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                            ._elem._elem) & 0xffffffff03;
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._5_3_ = 0;
            uVar8 = *(undefined8 *)
                     ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                             ._elem._elem + 9);
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._9_3_ = (undefined3)uVar8;
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._8_4_ =
                 (uint)(uint3)local_168.super_SelectedLiteral.interpreted.
                              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              ._elem._elem._9_3_ << 8;
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem.init._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            .
            super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            ._content[0xf] = (char)((ulong)uVar8 >> 0x38);
            uVar5 = *(undefined4 *)
                     ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                             ._elem._elem + 0x11);
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem._17_3_ = (undefined3)uVar5;
            local_168.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._elem._elem.init._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            .
            super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            ._content[0x13] = (char)((uint)uVar5 >> 0x18);
          }
          local_168.super_SelectedLiteral._44_4_ =
               *(undefined4 *)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.field_0x2c;
          Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs(&local_c0,&local_168);
          (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[9])(pNVar16,&local_c0);
          ensureIntermediateNodeEfficiency((IntermediateNode **)ppNVar23);
          ::Lib::
          BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
          ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                         *)&local_208);
          iVar24 = 1;
        }
        else {
          pTVar25 = &(*leaf)->_term;
          local_208._capacity = 0x40;
          local_208._stack = (TermList **)::operator_new(0x200,0x10);
          local_208._end =
               (TermList **)(&((Entry *)local_208._stack)->field_0 + local_208._capacity * 2);
          local_208._cursor = (TermList **)(Entry *)local_208._stack;
LAB_0033383b:
          while( true ) {
            if ((this_01->_content == pTVar25->_content) ||
               (bVar12 = Kernel::TermList::sameTop
                                   ((TermList)pTVar25->_content,(TermList)this_01->_content),
               !bVar12)) break;
            t = (Term *)pTVar25->_content;
            uVar7 = this_01->_content;
            if ((t->_args[0]._content & 8) != 0) {
              t = Kernel::Term::cloneNonShared(t);
              pTVar25->_content = (uint64_t)t;
            }
            uVar19 = (ulong)(*(uint *)&t->field_0xc & 0xfffffff);
            pTVar25 = t->_args + uVar19;
            lVar4 = uVar7 + (ulong)(*(uint *)(uVar7 + 0xc) & 0xfffffff) * 8;
            this_01 = (TermList *)(lVar4 + 0x28);
            if ((t->_args[uVar19 - 1]._content & 3) != 2) {
              if (local_208._cursor == local_208._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_208);
              }
              *local_208._cursor = t->_args + (uVar19 - 1);
              local_208._cursor = (TermList **)((long)local_208._cursor + 8);
              pTVar26 = (TermList *)(lVar4 + 0x20);
              if (local_208._cursor == local_208._end) {
                ::Lib::Stack<Kernel::TermList_*>::expand(&local_208);
              }
              goto LAB_00333a04;
            }
          }
          bVar12 = Kernel::TermList::sameTop
                             ((TermList)pTVar25->_content,(TermList)this_01->_content);
          if (!bVar12) {
            uVar19 = pTVar25->_content;
            if ((~(uint)uVar19 & 3) == 0) {
              uVar15 = (uint)(uVar19 >> 2);
            }
            else {
              uVar15 = local_1a0->_nextVar;
              local_1a0->_nextVar = uVar15 + 1;
              if (insert::unresolvedSplits._capacity == insert::unresolvedSplits._size) {
                ::Lib::
                BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                ::expand(&insert::unresolvedSplits);
              }
              pUVar3 = insert::unresolvedSplits._data1;
              uVar14 = insert::unresolvedSplits._size + 1;
              insert::unresolvedSplits._size = uVar14;
              insert::unresolvedSplits._data1[uVar14].var = uVar15;
              pUVar3[uVar14].original._content = uVar19;
              ::Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
              ::bubbleUp(&insert::unresolvedSplits,insert::unresolvedSplits._size);
              pTVar25->_content = (ulong)(uVar15 * 4 + 3);
            }
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      (pBVar11,uVar15,(TermList)this_01->_content);
          }
          if (local_208._cursor != local_208._stack) goto code_r0x0033399d;
          iVar24 = 2;
          if (pBVar11->_size == 0) {
            ensureLeafEfficiency((Leaf **)leaf);
            pNVar16 = *leaf;
            local_198.super_SelectedLiteral.litIdx =
                 (local_1b0->super_SelectedSummand).super_SelectedLiteral.litIdx;
            local_198.super_SelectedLiteral.cl =
                 (local_1b0->super_SelectedSummand).super_SelectedLiteral.cl;
            local_198.super_SelectedLiteral.interpreted.
            super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
            ._isSome = (local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                       super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                       ._isSome;
            if (local_198.super_SelectedLiteral.interpreted.
                super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                ._isSome == true) {
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._21_7_ = 0;
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._0_5_ =
                   CONCAT41(*(undefined4 *)
                             ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.
                                     interpreted.
                                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                     ._elem._elem + 1),
                            *(undefined1 *)
                             &(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                              ._elem._elem) & 0xffffffff03;
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._5_3_ = 0;
              uVar8 = *(undefined8 *)
                       ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                               super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                               ._elem._elem + 9);
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._9_3_ = (undefined3)uVar8;
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._8_4_ =
                   (uint)(uint3)local_198.super_SelectedLiteral.interpreted.
                                super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                                ._elem._elem._9_3_ << 8;
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._12_4_ = (undefined4)((ulong)uVar8 >> 0x18);
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem.init._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              .
              super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              ._content[0xf] = (char)((ulong)uVar8 >> 0x38);
              uVar5 = *(undefined4 *)
                       ((long)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.interpreted.
                               super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                               ._elem._elem + 0x11);
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem._17_3_ = (undefined3)uVar5;
              local_198.super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem.init._inner.
              super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              .
              super_RawCoproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>
              ._content[0x13] = (char)((uint)uVar5 >> 0x18);
            }
            local_198.super_SelectedLiteral._44_4_ =
                 *(undefined4 *)&(local_1b0->super_SelectedSummand).super_SelectedLiteral.field_0x2c
            ;
            Inferences::ALASCA::FourierMotzkinConf::Rhs::Rhs((Rhs *)(local_108 + 0x18),&local_198);
            iVar24 = 1;
            (*((Node *)&pNVar16->_vptr_Node)->_vptr_Node[9])(pNVar16,(Rhs *)(local_108 + 0x18));
          }
          if ((Entry *)local_208._stack != (Entry *)0x0) {
            uVar19 = local_208._capacity * 8 + 0xf & 0xfffffffffffffff0;
            if (uVar19 == 0) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_208._stack;
            }
            else if (uVar19 < 0x11) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_208._stack;
            }
            else if (uVar19 < 0x19) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_208._stack;
            }
            else if (uVar19 < 0x21) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_208._stack;
            }
            else if (uVar19 < 0x31) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_208._stack;
            }
            else if (uVar19 < 0x41) {
              *local_208._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
              ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_208._stack;
            }
            else {
              operator_delete(local_208._stack,0x10);
            }
          }
        }
      }
      ppNVar23 = leaf;
    } while (iVar24 == 2);
  }
  return;
code_r0x0033399d:
  this_01 = (TermList *)(((Entry *)((long)local_208._cursor + -0x10))->_val)._content;
  pEVar18 = (Entry *)((long)local_208._cursor + -0x10);
  pTVar25 = *(TermList **)((long)local_208._cursor + -0x10);
  local_208._cursor = (TermList **)pEVar18;
  if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar25 + -1))->_vars & 3) != 2) {
    if (pEVar18 == (Entry *)local_208._end) {
      ::Lib::Stack<Kernel::TermList_*>::expand(&local_208);
    }
    *local_208._cursor = (TermList *)(pTVar25 + -1);
    local_208._cursor = (TermList **)((long)local_208._cursor + 8);
    pTVar26 = this_01 + -1;
    if (local_208._cursor == local_208._end) {
      ::Lib::Stack<Kernel::TermList_*>::expand(&local_208);
    }
LAB_00333a04:
    *(uint64_t *)local_208._cursor = (uint64_t)pTVar26;
    local_208._cursor = local_208._cursor + 1;
  }
  goto LAB_0033383b;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}